

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
binary_search_lower_bound<int>
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
           *this,int l,int r,int *key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  while (iVar3 = l, r - iVar3 != 0 && iVar3 <= r) {
    iVar2 = (r - iVar3) / 2;
    iVar1 = iVar2 + iVar3;
    l = iVar2 + 1 + iVar3;
    if (*key <= this->key_slots_[iVar1]) {
      r = iVar1;
      l = iVar3;
    }
  }
  return iVar3;
}

Assistant:

inline int binary_search_lower_bound(int l, int r, const K& key) const {
    while (l < r) {
      int mid = l + (r - l) / 2;
      if (key_greaterequal(ALEX_DATA_NODE_KEY_AT(mid), key)) {
        r = mid;
      } else {
        l = mid + 1;
      }
    }
    return l;
  }